

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O3

void elf64_initoutput(GlobalVars *gv,uint32_t init_file_offset,int8_t output_endianess)

{
  node *n;
  
  elf_initoutput(gv,init_file_offset,output_endianess);
  elf_initsymtabs(0x18,elf64_initsym);
  reloclist = elf_newreloclist(0x18,(ulong)(gv->reloctab_format == '\x02') * 8 + 0x10,
                               elf64_initreloc);
  n = (node *)alloczero(0x50);
  addtail(&shdrlist,n);
  elfshdridx = elfshdridx + 1;
  return;
}

Assistant:

static void elf64_initoutput(struct GlobalVars *gv,uint32_t init_file_offset,
                             int8_t output_endianess)
/* initialize section header, program header, relocation, symbol, */
/* string and section header string lists */
{
  elf_initoutput(gv,init_file_offset,output_endianess);
  elf_initsymtabs(sizeof(struct Elf64_Sym),elf64_initsym);

  reloclist = elf_newreloclist(sizeof(struct Elf64_Rela),
                               gv->reloctab_format!=RTAB_ADDEND ?
                               sizeof(struct Elf64_Rel) :
                               sizeof(struct Elf64_Rela),
                               elf64_initreloc);
  elf64_newshdr();          /* first Shdr is always zero */
}